

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Psr_ManWriteVerilogArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vSigs,int Start,int Stop,int fOdd)

{
  char *pcVar1;
  int Sig;
  
  if (0 < vSigs->nSize) {
    for (; Start < Stop; Start = Start + 1) {
      Sig = Vec_IntEntry(vSigs,Start);
      if (fOdd == 0 || (Start & 1U) != 0) {
        Psr_ManWriteVerilogSignal(pFile,p,Sig);
        pcVar1 = "    \"%s\", ";
        if (Stop - 1U == Start) {
          pcVar1 = "T = %d\t\t";
        }
        fputs(pcVar1 + 8,(FILE *)pFile);
      }
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacWriteVer.c"
                ,0x46,
                "void Psr_ManWriteVerilogArray(FILE *, Psr_Ntk_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Psr_ManWriteVerilogArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vSigs, int Start, int Stop, int fOdd )
{
    int i, Sig;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntryStartStop( vSigs, Sig, i, Start, Stop )
    {
        if ( fOdd && !(i & 1) )
            continue;
        Psr_ManWriteVerilogSignal( pFile, p, Sig );
        fprintf( pFile, "%s", i == Stop - 1 ? "" : ", " );
    }
}